

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O1

bool iDynTree::exportInertial(SpatialInertia *inertia,xmlNodePtr parent_element)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  xmlNodePtr parent_element_00;
  undefined8 uVar4;
  double d;
  string bufStr;
  char buf [25];
  RotationalInertia rotInertia;
  undefined1 *local_120;
  char *local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  SpatialInertia *local_100;
  Rotation local_f8 [80];
  double local_a8;
  double local_a0;
  double local_98;
  double local_88;
  double local_80;
  double local_68;
  Position local_48 [24];
  
  local_120 = &local_110;
  local_118 = (char *)0x0;
  local_110 = 0;
  local_100 = inertia;
  parent_element_00 = (xmlNodePtr)xmlNewChild(parent_element,0,"inertial",0);
  uVar4 = xmlNewChild(parent_element_00,0,"mass",0);
  d = (double)iDynTree::SpatialInertia::getMass();
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    iVar3 = idyntree_private_fpconv_dtoa(d,(char *)&local_a8);
    pcVar1 = local_118;
    *(undefined1 *)((long)&local_a8 + (long)iVar3) = 0;
    strlen((char *)&local_a8);
    std::__cxx11::string::_M_replace((ulong)&local_120,0,pcVar1,(ulong)&local_a8);
  }
  xmlNewProp(uVar4,"value",local_120);
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    iDynTree::Rotation::Identity();
    iDynTree::SpatialInertia::getCenterOfMass();
    iDynTree::Transform::Transform((Transform *)&local_a8,local_f8,local_48);
    bVar2 = exportTransform((Transform *)&local_a8,parent_element_00);
  }
  else {
    bVar2 = false;
  }
  uVar4 = xmlNewChild(parent_element_00,0,"inertia",0);
  iDynTree::SpatialInertia::getRotationalInertiaWrtCenterOfMass();
  if (bVar2 == false) {
    bVar2 = false;
  }
  else {
    bVar2 = (ulong)ABS(local_a8) < 0x7ff0000000000000;
    if ((ulong)ABS(local_a8) < 0x7ff0000000000000) {
      iVar3 = idyntree_private_fpconv_dtoa(local_a8,(char *)local_f8);
      pcVar1 = local_118;
      local_f8[iVar3] = (Rotation)0x0;
      strlen((char *)local_f8);
      std::__cxx11::string::_M_replace((ulong)&local_120,0,pcVar1,(ulong)local_f8);
    }
  }
  xmlNewProp(uVar4,"ixx",local_120);
  if (bVar2) {
    bVar2 = (ulong)ABS(local_a0) < 0x7ff0000000000000;
    if ((ulong)ABS(local_a0) < 0x7ff0000000000000) {
      iVar3 = idyntree_private_fpconv_dtoa(local_a0,(char *)local_f8);
      pcVar1 = local_118;
      local_f8[iVar3] = (Rotation)0x0;
      strlen((char *)local_f8);
      std::__cxx11::string::_M_replace((ulong)&local_120,0,pcVar1,(ulong)local_f8);
    }
  }
  else {
    bVar2 = false;
  }
  xmlNewProp(uVar4,"ixy",local_120);
  if (bVar2) {
    bVar2 = (ulong)ABS(local_98) < 0x7ff0000000000000;
    if ((ulong)ABS(local_98) < 0x7ff0000000000000) {
      iVar3 = idyntree_private_fpconv_dtoa(local_98,(char *)local_f8);
      pcVar1 = local_118;
      local_f8[iVar3] = (Rotation)0x0;
      strlen((char *)local_f8);
      std::__cxx11::string::_M_replace((ulong)&local_120,0,pcVar1,(ulong)local_f8);
    }
  }
  else {
    bVar2 = false;
  }
  xmlNewProp(uVar4,"ixz",local_120);
  if (bVar2) {
    bVar2 = (ulong)ABS(local_88) < 0x7ff0000000000000;
    if ((ulong)ABS(local_88) < 0x7ff0000000000000) {
      iVar3 = idyntree_private_fpconv_dtoa(local_88,(char *)local_f8);
      pcVar1 = local_118;
      local_f8[iVar3] = (Rotation)0x0;
      strlen((char *)local_f8);
      std::__cxx11::string::_M_replace((ulong)&local_120,0,pcVar1,(ulong)local_f8);
    }
  }
  else {
    bVar2 = false;
  }
  xmlNewProp(uVar4,"iyy",local_120);
  if (bVar2) {
    bVar2 = (ulong)ABS(local_80) < 0x7ff0000000000000;
    if ((ulong)ABS(local_80) < 0x7ff0000000000000) {
      iVar3 = idyntree_private_fpconv_dtoa(local_80,(char *)local_f8);
      pcVar1 = local_118;
      local_f8[iVar3] = (Rotation)0x0;
      strlen((char *)local_f8);
      std::__cxx11::string::_M_replace((ulong)&local_120,0,pcVar1,(ulong)local_f8);
    }
  }
  else {
    bVar2 = false;
  }
  xmlNewProp(uVar4,"iyz",local_120);
  if (bVar2) {
    bVar2 = (ulong)ABS(local_68) < 0x7ff0000000000000;
    if ((ulong)ABS(local_68) < 0x7ff0000000000000) {
      iVar3 = idyntree_private_fpconv_dtoa(local_68,(char *)local_f8);
      pcVar1 = local_118;
      local_f8[iVar3] = (Rotation)0x0;
      strlen((char *)local_f8);
      std::__cxx11::string::_M_replace((ulong)&local_120,0,pcVar1,(ulong)local_f8);
    }
  }
  else {
    bVar2 = false;
  }
  xmlNewProp(uVar4,"izz",local_120);
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  return bVar2;
}

Assistant:

bool exportInertial(const SpatialInertia &inertia, xmlNodePtr parent_element)
{
    bool ok=true;
    std::string bufStr;
    xmlNodePtr inertial = xmlNewChild(parent_element, NULL, BAD_CAST "inertial", NULL);


    xmlNodePtr mass_xml = xmlNewChild(inertial, NULL, BAD_CAST "mass", NULL);
    ok = ok && doubleToStringWithClassicLocale(inertia.getMass(), bufStr);
    xmlNewProp(mass_xml, BAD_CAST "value", BAD_CAST bufStr.c_str());

    ok = ok && exportTransform(Transform(Rotation::Identity(), inertia.getCenterOfMass()), inertial);

    xmlNodePtr inertia_xml = xmlNewChild(inertial, NULL, BAD_CAST "inertia", NULL);
    RotationalInertia rotInertia = inertia.getRotationalInertiaWrtCenterOfMass();
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 0), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixx", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 1), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixy", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(0, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "ixz", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(1, 1), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "iyy", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(1, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "iyz", BAD_CAST bufStr.c_str());
    ok = ok && doubleToStringWithClassicLocale(rotInertia(2, 2), bufStr);
    xmlNewProp(inertia_xml, BAD_CAST "izz", BAD_CAST bufStr.c_str());

    return ok;
}